

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

Pos estimateSpawn(Generator *g,uint64_t *rng)

{
  uint uVar1;
  Pos PVar2;
  ulong uVar3;
  Pos PVar4;
  uint64_t validB;
  uint64_t s;
  int found;
  
  uVar1 = g->mc;
  if ((int)uVar1 < 2) {
    uVar3 = 0;
    PVar4.x = 0;
    PVar4.z = 0;
  }
  else if (uVar1 < 0x16) {
    validB = 0x6c0032;
    if (uVar1 < 4) {
      validB = 0x70;
    }
    s = g->seed & 0xffffffffffff ^ 0x5deece66d;
    PVar2 = locateBiome(g,0,0x3f,0,0x100,validB,0,&s,&found);
    uVar3 = 0x800000000;
    if (found != 0) {
      uVar3 = (ulong)PVar2 & 0xffffffff00000000;
    }
    PVar4.x = 8;
    PVar4.z = 0;
    if (found != 0) {
      PVar4 = PVar2;
    }
    if (rng != (uint64_t *)0x0) {
      *rng = s;
    }
  }
  else {
    s = 0;
    _found = calcFitness(g,0,0);
    findFittest(g,(Pos *)&s,(uint64_t *)&found,2048.0,512.0);
    findFittest(g,(Pos *)&s,(uint64_t *)&found,512.0,32.0);
    PVar4 = (Pos)(s & (ulong)DAT_00126c10 | (ulong)DAT_00126bf0);
    uVar3 = (ulong)PVar4 & 0xfffffff800000000;
  }
  return (Pos)((ulong)PVar4 & 0xffffffff | uVar3);
}

Assistant:

Pos estimateSpawn(const Generator *g, uint64_t *rng)
{
    Pos spawn = {0, 0};

    if (g->mc <= MC_B1_7)
    {
        // finds a random sandblock (location is not fixed)
        return spawn;
    }
    else if (g->mc <= MC_1_17)
    {
        int found;
        uint64_t spawn_biomes = g_spawn_biomes_17;
        if (g->mc <= MC_1_0)
            spawn_biomes = (1ULL << forest) | (1ULL << swamp) |(1ULL << taiga);
        uint64_t s;
        setSeed(&s, g->seed);
        spawn = locateBiome(g, 0, 63, 0, 256, spawn_biomes, 0, &s, &found);
        if (!found)
            spawn.x = spawn.z = 8;
        if (rng)
            *rng = s;
    }
    else
    {
        spawn = findFittestPos(g);
    }

    return spawn;
}